

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O1

MutCommonExpr __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCommonExpr
          (BasicProblem<mp::BasicProblemParams<int>_> *this,NumericExpr expr)

{
  pointer *ppBVar1;
  pointer pLVar2;
  pointer pLVar3;
  iterator __position;
  iterator __position_00;
  MutCommonExpr MVar4;
  ExprBase local_98;
  LinearExpr local_90;
  
  pLVar2 = (this->linear_exprs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar3 = (this->linear_exprs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_90.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
  super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_90.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
             m_data.m_storage;
  local_90.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
  super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity = 6;
  local_90.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
  super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_size = 0;
  local_98.impl_ = (Impl *)expr.super_ExprBase.impl_;
  std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::emplace_back<mp::LinearExpr>
            (&this->linear_exprs_,&local_90);
  if (6 < local_90.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
          super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity) {
    operator_delete(local_90.terms_.
                    super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                    super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr,
                    local_90.terms_.
                    super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                    super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity
                    << 4);
  }
  __position._M_current =
       (this->nonlinear_exprs_).
       super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->nonlinear_exprs_).
      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,std::allocator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
    ::_M_realloc_insert<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>const&>
              ((vector<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,std::allocator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
                *)&this->nonlinear_exprs_,__position,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_98);
  }
  else {
    ((__position._M_current)->super_ExprBase).impl_ = local_98.impl_;
    ppBVar1 = &(this->nonlinear_exprs_).
               super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
  }
  local_90.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
  super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)CONCAT44(local_90.terms_.
                     super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                     super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr.
                     _4_4_,0x80000000);
  __position_00._M_current =
       (this->common_expr_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->common_expr_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->common_expr_positions_,__position_00,(int *)&local_90);
  }
  else {
    *__position_00._M_current = -0x80000000;
    (this->common_expr_positions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  MVar4.
  super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       (int)((ulong)((long)pLVar3 - (long)pLVar2) >> 3) * -0x11111111;
  MVar4.
  super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ = this;
  MVar4.
  super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ = 0;
  return (MutCommonExpr)
         MVar4.
         super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>;
}

Assistant:

MutCommonExpr AddCommonExpr(NumericExpr expr) {
    std::size_t num_exprs = linear_exprs_.size();
    MP_ASSERT(num_exprs < MP_MAX_PROBLEM_ITEMS, "too many expressions");
    linear_exprs_.push_back(LinearExpr());
    nonlinear_exprs_.push_back(expr);
    common_expr_positions_.push_back(CommonExprPosDflt());
    return MutCommonExpr(this, static_cast<int>(num_exprs));
  }